

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfKeyCodeAttribute.cpp
# Opt level: O3

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::KeyCode>::readValueFrom
          (TypedAttribute<Imf_2_5::KeyCode> *this,IStream *is,int size,int version)

{
  KeyCode *this_00;
  char b [4];
  int local_1c;
  
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  this_00 = &this->_value;
  KeyCode::setFilmMfcCode(this_00,local_1c);
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  KeyCode::setFilmType(this_00,local_1c);
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  KeyCode::setPrefix(this_00,local_1c);
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  KeyCode::setCount(this_00,local_1c);
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  KeyCode::setPerfOffset(this_00,local_1c);
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  KeyCode::setPerfsPerFrame(this_00,local_1c);
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  KeyCode::setPerfsPerCount(this_00,local_1c);
  return;
}

Assistant:

void
KeyCodeAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int size, int version)
{
    int tmp;

    Xdr::read <StreamIO> (is, tmp);
    _value.setFilmMfcCode (tmp);

    Xdr::read <StreamIO> (is, tmp);
    _value.setFilmType (tmp);

    Xdr::read <StreamIO> (is, tmp);
    _value.setPrefix (tmp);

    Xdr::read <StreamIO> (is, tmp);
    _value.setCount (tmp);

    Xdr::read <StreamIO> (is, tmp);
    _value.setPerfOffset (tmp);

    Xdr::read <StreamIO> (is, tmp);
    _value.setPerfsPerFrame (tmp);

    Xdr::read <StreamIO> (is, tmp);
    _value.setPerfsPerCount (tmp);
}